

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveConditional.cpp
# Opt level: O1

void __thiscall CDirectiveConditional::writeTempData(CDirectiveConditional *this,TempData *tempData)

{
  CAssemblerCommand *pCVar1;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *puVar2;
  
  if (this->previousResult == true) {
    pCVar1 = (this->ifBlock)._M_t.
             super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
             super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
             super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
    puVar2 = &this->ifBlock;
  }
  else {
    pCVar1 = (this->elseBlock)._M_t.
             super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
             super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
             super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
    if (pCVar1 == (CAssemblerCommand *)0x0) {
      return;
    }
    puVar2 = &this->elseBlock;
  }
  CAssemblerCommand::applyFileInfo(pCVar1);
  pCVar1 = (puVar2->_M_t).
           super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
           super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
           super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl;
  (*pCVar1->_vptr_CAssemblerCommand[4])(pCVar1,tempData);
  return;
}

Assistant:

void CDirectiveConditional::writeTempData(TempData& tempData) const
{
	if (previousResult)
	{
		ifBlock->applyFileInfo();
		ifBlock->writeTempData(tempData);
	} else if (elseBlock != nullptr)
	{
		elseBlock->applyFileInfo();
		elseBlock->writeTempData(tempData);
	}
}